

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O1

uint MCRegisterInfo_getSubReg(MCRegisterInfo *RI,uint Reg,uint Idx)

{
  ushort uVar1;
  ushort *puVar2;
  uint uVar3;
  ushort *puVar4;
  
  puVar4 = RI->DiffLists + RI->Desc[Reg].SubRegs;
  puVar2 = puVar4;
  uVar3 = Reg;
  if (RI->DiffLists != (MCPhysReg *)0x0) {
    uVar3 = Reg + *puVar4;
    puVar2 = puVar4 + 1;
    if (*puVar4 == 0) {
      puVar2 = (ushort *)0x0;
    }
  }
  if (puVar2 == (ushort *)0x0) {
    return 0;
  }
  puVar4 = RI->SubRegIndices + RI->Desc[Reg].SubRegIndices;
  do {
    if (*puVar4 == Idx) {
      return uVar3 & 0xffff;
    }
    uVar1 = *puVar2;
    puVar2 = puVar2 + 1;
    uVar3 = uVar3 + uVar1;
    puVar4 = puVar4 + 1;
  } while (uVar1 != 0);
  return 0;
}

Assistant:

unsigned MCRegisterInfo_getSubReg(MCRegisterInfo *RI, unsigned Reg, unsigned Idx)
{
	DiffListIterator iter;
	uint16_t *SRI = RI->SubRegIndices + RI->Desc[Reg].SubRegIndices;

	DiffListIterator_init(&iter, (MCPhysReg)Reg, RI->DiffLists + RI->Desc[Reg].SubRegs);
	DiffListIterator_next(&iter);

	while(DiffListIterator_isValid(&iter)) {
		if (*SRI == Idx)
			return DiffListIterator_getVal(&iter);
		DiffListIterator_next(&iter);
		++SRI;
	}

	return 0;
}